

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTForeFlight.cpp
# Opt level: O1

void __thiscall
ForeFlightSender::SendAtt(ForeFlightSender *this,positionTy *pos,double param_2,double param_3)

{
  ssize_t sVar1;
  size_t in_RCX;
  undefined8 extraout_RDX;
  int in_R8D;
  _Rb_tree_node_base *p_Var3;
  undefined1 auVar4 [16];
  char s [200];
  char acStack_e8 [200];
  _Base_ptr p_Var2;
  
  snprintf(acStack_e8,200,"XATTLiveTraffic,%.1f,%.1f,%.1f",pos->_head,pos->_pitch,pos->_roll);
  p_Var2 = (this->mapUdp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = p_Var2;
  while ((_Rb_tree_header *)p_Var2 != &(this->mapUdp)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = auVar4._0_8_;
    if (*(int *)&p_Var3[2]._M_parent != -1) {
      sVar1 = XPMP2::SocketNetworking::send
                        ((SocketNetworking *)(p_Var3 + 2),(int)acStack_e8,auVar4._8_8_,in_RCX,in_R8D
                        );
      if ((char)sVar1 == '\0') {
        XPMP2::SocketNetworking::Close((SocketNetworking *)(p_Var3 + 2));
      }
    }
    auVar4 = std::_Rb_tree_increment(p_Var3);
    p_Var2 = auVar4._0_8_;
  }
  return;
}

Assistant:

void ForeFlightSender::SendAtt (const positionTy& pos, double /*speed_m*/, double /*track*/)
{
    // format the string to send
    char s[200];
    snprintf(s,sizeof(s),
             "XATTLiveTraffic,%.1f,%.1f,%.1f",
             pos.heading(),                     // heading
             pos.pitch(),                       // pitch
             pos.roll());                       // roll
    
    // send the string to all clients
    for (auto& p: mapUdp)
        if (p.second.isOpen() && !p.second.send(s))
            p.second.Close();
    // (no DebugLogRaw...not at 5Hz!)
}